

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall
leveldb::Block::Iter::Iter
          (Iter *this,Comparator *comparator,char *data,uint32_t restarts,uint32_t num_restarts)

{
  undefined4 in_ECX;
  CleanupFunction in_RDX;
  _func_int **in_RSI;
  Iterator *in_RDI;
  undefined4 in_R8D;
  
  Iterator::Iterator(in_RDI);
  in_RDI->_vptr_Iterator = (_func_int **)&PTR__Iter_0012cc08;
  in_RDI[1]._vptr_Iterator = in_RSI;
  in_RDI[1].cleanup_head_.function = in_RDX;
  *(undefined4 *)&in_RDI[1].cleanup_head_.arg1 = in_ECX;
  *(undefined4 *)((long)&in_RDI[1].cleanup_head_.arg1 + 4) = in_R8D;
  *(undefined4 *)&in_RDI[1].cleanup_head_.arg2 = *(undefined4 *)&in_RDI[1].cleanup_head_.arg1;
  *(undefined4 *)((long)&in_RDI[1].cleanup_head_.arg2 + 4) =
       *(undefined4 *)((long)&in_RDI[1].cleanup_head_.arg1 + 4);
  std::__cxx11::string::string((string *)&in_RDI[1].cleanup_head_.next);
  Slice::Slice((Slice *)&in_RDI[2].cleanup_head_.arg2);
  Status::Status((Status *)(in_RDI + 3));
  return;
}

Assistant:

Iter(const Comparator* comparator, const char* data, uint32_t restarts,
       uint32_t num_restarts)
      : comparator_(comparator),
        data_(data),
        restarts_(restarts),
        num_restarts_(num_restarts),
        current_(restarts_),
        restart_index_(num_restarts_) {
    assert(num_restarts_ > 0);
  }